

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O3

void srunner_run_teardown(List *fixture_list,fork_status fork_usage)

{
  int iVar1;
  void *pvVar2;
  
  check_list_front(fixture_list);
  iVar1 = check_list_at_end(fixture_list);
  while( true ) {
    if (iVar1 != 0) {
      return;
    }
    pvVar2 = check_list_val(fixture_list);
    send_ctx_info(CK_CTX_TEARDOWN);
    if ((fork_usage == CK_NOFORK) &&
       (iVar1 = _setjmp((__jmp_buf_tag *)error_jmp_buffer), iVar1 != 0)) break;
    (**(code **)((long)pvVar2 + 8))();
    check_list_advance(fixture_list);
    iVar1 = check_list_at_end(fixture_list);
  }
  return;
}

Assistant:

static void srunner_run_teardown(List * fixture_list, enum fork_status fork_usage)
{
    for(check_list_front(fixture_list); !check_list_at_end(fixture_list);
        check_list_advance(fixture_list))
    {
        Fixture *fixture = (Fixture *)check_list_val(fixture_list);
        send_ctx_info(CK_CTX_TEARDOWN);

        if(fork_usage == CK_NOFORK)
        {
            if(0 == setjmp(error_jmp_buffer))
            {
                fixture->fun();
            }
            else
            {
                /* Abort the remaining teardowns */
                break;
            }
        }
        else
        {
            fixture->fun();
        }
    }
}